

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaPSVIIDCKeyPtr **pppxVar1;
  xmlSchemaIDCAugPtr pxVar2;
  xmlSchemaPSVIIDCNodePtr pxVar3;
  xmlSchemaPSVIIDCKeyPtr pxVar4;
  xmlSchemaValPtr value;
  xmlSchemaIDCMatcherPtr pxVar5;
  xmlSchemaIDCMatcherPtr pxVar6;
  void *pvVar7;
  xmlDictPtr pxVar8;
  xmlSchemaItemListPtr pxVar9;
  xmlSchemaIDCAugPtr_conflict pxVar10;
  long lVar11;
  xmlSchemaIDCMatcherPtr_conflict pxVar12;
  
  if ((vctxt->xsiAssemble != 0) && (vctxt->schema != (xmlSchemaPtr)0x0)) {
    xmlSchemaFree(vctxt->schema);
    vctxt->schema = (xmlSchemaPtr)0x0;
  }
  if (vctxt != (xmlSchemaValidCtxtPtr)0x0) {
    vctxt->flags = 0;
    vctxt->validationRoot = (xmlNodePtr)0x0;
    vctxt->doc = (xmlDocPtr)0x0;
    vctxt->reader = (xmlTextReaderPtr)0x0;
    vctxt->hasKeyrefs = 0;
    if (vctxt->value != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(vctxt->value);
      vctxt->value = (xmlSchemaValPtr)0x0;
    }
    pxVar10 = vctxt->aidcs;
    if (pxVar10 != (xmlSchemaIDCAugPtr_conflict)0x0) {
      do {
        pxVar2 = pxVar10->next;
        (*xmlFree)(pxVar10);
        pxVar10 = pxVar2;
      } while (pxVar2 != (xmlSchemaIDCAugPtr)0x0);
      vctxt->aidcs = (xmlSchemaIDCAugPtr_conflict)0x0;
    }
    if (vctxt->idcNodes != (xmlSchemaPSVIIDCNodePtr *)0x0) {
      if (0 < vctxt->nbIdcNodes) {
        lVar11 = 0;
        do {
          pxVar3 = vctxt->idcNodes[lVar11];
          (*xmlFree)(pxVar3->keys);
          (*xmlFree)(pxVar3);
          lVar11 = lVar11 + 1;
        } while (lVar11 < vctxt->nbIdcNodes);
      }
      (*xmlFree)(vctxt->idcNodes);
      vctxt->idcNodes = (xmlSchemaPSVIIDCNodePtr *)0x0;
      vctxt->nbIdcNodes = 0;
      vctxt->sizeIdcNodes = 0;
    }
    if (vctxt->idcKeys != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
      pppxVar1 = &vctxt->idcKeys;
      if (0 < vctxt->nbIdcKeys) {
        lVar11 = 0;
        do {
          pxVar4 = (*pppxVar1)[lVar11];
          value = pxVar4->val;
          if (value != (xmlSchemaValPtr)0x0) {
            xmlSchemaFreeValue(value);
          }
          (*xmlFree)(pxVar4);
          lVar11 = lVar11 + 1;
        } while (lVar11 < vctxt->nbIdcKeys);
      }
      (*xmlFree)(*pppxVar1);
      *pppxVar1 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
      vctxt->nbIdcKeys = 0;
      vctxt->sizeIdcKeys = 0;
    }
    if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      xmlSchemaFreeIDCStateObjList(vctxt->xpathStates);
      vctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    }
    if (vctxt->nbAttrInfos != 0) {
      xmlSchemaClearAttrInfos(vctxt);
    }
    if ((vctxt->elemInfos != (xmlSchemaNodeInfoPtr *)0x0) && (0 < vctxt->sizeElemInfos)) {
      lVar11 = 0;
      do {
        if (vctxt->elemInfos[lVar11] == (xmlSchemaNodeInfoPtr)0x0) break;
        xmlSchemaClearElemInfo(vctxt,vctxt->elemInfos[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < vctxt->sizeElemInfos);
    }
    pxVar9 = vctxt->nodeQNames;
    if (pxVar9->items != (void **)0x0) {
      (*xmlFree)(pxVar9->items);
      pxVar9->items = (void **)0x0;
    }
    pxVar9->nbItems = 0;
    pxVar9->sizeItems = 0;
    xmlDictFree(vctxt->dict);
    pxVar8 = xmlDictCreate();
    vctxt->dict = pxVar8;
    if (vctxt->filename != (char *)0x0) {
      (*xmlFree)(vctxt->filename);
      vctxt->filename = (char *)0x0;
    }
    pxVar12 = vctxt->idcMatcherCache;
    if (pxVar12 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
      do {
        pxVar5 = pxVar12->nextCached;
        do {
          pxVar6 = pxVar12->next;
          if (pxVar12->keySeqs != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
            if (0 < pxVar12->sizeKeySeqs) {
              lVar11 = 0;
              do {
                if (pxVar12->keySeqs[lVar11] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                  (*xmlFree)(pxVar12->keySeqs[lVar11]);
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < pxVar12->sizeKeySeqs);
            }
            (*xmlFree)(pxVar12->keySeqs);
          }
          pxVar9 = pxVar12->targets;
          if (pxVar9 != (xmlSchemaItemListPtr)0x0) {
            if ((pxVar12->idcType == 0x18) && (0 < pxVar9->nbItems)) {
              lVar11 = 0;
              do {
                pvVar7 = pxVar9->items[lVar11];
                (*xmlFree)(*(void **)((long)pvVar7 + 8));
                (*xmlFree)(pvVar7);
                lVar11 = lVar11 + 1;
                pxVar9 = pxVar12->targets;
              } while (lVar11 < pxVar9->nbItems);
            }
            pxVar9 = pxVar12->targets;
            if (pxVar9 != (xmlSchemaItemListPtr)0x0) {
              if (pxVar9->items != (void **)0x0) {
                (*xmlFree)(pxVar9->items);
              }
              (*xmlFree)(pxVar9);
            }
          }
          if (pxVar12->htab != (xmlHashTablePtr)0x0) {
            xmlHashFree(pxVar12->htab,xmlFreeIDCHashEntry);
          }
          (*xmlFree)(pxVar12);
          pxVar12 = pxVar6;
        } while (pxVar6 != (xmlSchemaIDCMatcherPtr)0x0);
        pxVar12 = pxVar5;
      } while (pxVar5 != (xmlSchemaIDCMatcherPtr)0x0);
      vctxt->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)0x0;
    }
  }
  return;
}

Assistant:

static void
xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt) {
    if (vctxt->xsiAssemble) {
	if (vctxt->schema != NULL) {
	    xmlSchemaFree(vctxt->schema);
	    vctxt->schema = NULL;
	}
    }
    xmlSchemaClearValidCtxt(vctxt);
}